

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2.c
# Opt level: O0

void WebRtcSpl_UpsampleBy2(int16_t *in,size_t len,int16_t *out,int32_t *filtState)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int16_t *piVar8;
  int local_68;
  int local_64;
  int32_t state7;
  int32_t state6;
  int32_t state5;
  int32_t state4;
  int32_t state3;
  int32_t state2;
  int32_t state1;
  int32_t state0;
  size_t i;
  int32_t out32;
  int32_t in32;
  int32_t diff;
  int32_t tmp2;
  int32_t tmp1;
  int32_t *filtState_local;
  int16_t *out_local;
  size_t len_local;
  int16_t *in_local;
  
  state5 = filtState[3];
  local_68 = filtState[7];
  local_64 = filtState[6];
  state7 = filtState[5];
  state6 = filtState[4];
  state4 = filtState[2];
  state3 = filtState[1];
  state2 = *filtState;
  filtState_local = (int32_t *)out;
  len_local = (size_t)in;
  for (_state1 = len; _state1 != 0; _state1 = _state1 - 1) {
    iVar2 = *(short *)len_local * 0x400;
    iVar3 = state2 + (iVar2 - state3 >> 0x10) * 0xcd4 + ((iVar2 - state3 & 0xffffU) * 0xcd4 >> 0x10)
    ;
    uVar4 = iVar3 - state4;
    iVar5 = state3 + ((int)uVar4 >> 0x10) * 0x5f79 + ((uVar4 & 0xffff) * 0x5f79 >> 0x10);
    uVar4 = iVar5 - state5;
    state5 = state4 + ((int)uVar4 >> 0x10) * 0xc178 + ((uVar4 & 0xffff) * 0xc178 >> 0x10);
    iVar1 = WebRtcSpl_SatW32ToW16(state5 + 0x200 >> 10);
    piVar8 = (int16_t *)((long)filtState_local + 2);
    *(int16_t *)filtState_local = iVar1;
    iVar6 = state6 + (iVar2 - state7 >> 0x10) * 0x2fa7 +
            ((iVar2 - state7 & 0xffffU) * 0x2fa7 >> 0x10);
    uVar4 = iVar6 - local_64;
    iVar7 = state7 + ((int)uVar4 >> 0x10) * 0x925f + ((uVar4 & 0xffff) * 0x925f >> 0x10);
    uVar4 = iVar7 - local_68;
    local_68 = local_64 + ((int)uVar4 >> 0x10) * 0xeb5f + ((uVar4 & 0xffff) * 0xeb5f >> 0x10);
    iVar1 = WebRtcSpl_SatW32ToW16(local_68 + 0x200 >> 10);
    filtState_local = filtState_local + 1;
    *piVar8 = iVar1;
    local_64 = iVar7;
    state7 = iVar6;
    state6 = iVar2;
    state4 = iVar5;
    state3 = iVar3;
    state2 = iVar2;
    len_local = len_local + 2;
  }
  *filtState = state2;
  filtState[1] = state3;
  filtState[2] = state4;
  filtState[3] = state5;
  filtState[4] = state6;
  filtState[5] = state7;
  filtState[6] = local_64;
  filtState[7] = local_68;
  return;
}

Assistant:

void WebRtcSpl_UpsampleBy2(const int16_t* in, size_t len,
                           int16_t* out, int32_t* filtState) {
  int32_t tmp1, tmp2, diff, in32, out32;
  size_t i;

  register int32_t state0 = filtState[0];
  register int32_t state1 = filtState[1];
  register int32_t state2 = filtState[2];
  register int32_t state3 = filtState[3];
  register int32_t state4 = filtState[4];
  register int32_t state5 = filtState[5];
  register int32_t state6 = filtState[6];
  register int32_t state7 = filtState[7];

  for (i = len; i > 0; i--) {
    // lower allpass filter
    in32 = (int32_t)(*in++) << 10;
    diff = in32 - state1;
    tmp1 = MUL_ACCUM_1(kResampleAllpass1[0], diff, state0);
    state0 = in32;
    diff = tmp1 - state2;
    tmp2 = MUL_ACCUM_1(kResampleAllpass1[1], diff, state1);
    state1 = tmp1;
    diff = tmp2 - state3;
    state3 = MUL_ACCUM_2(kResampleAllpass1[2], diff, state2);
    state2 = tmp2;

    // round; limit amplitude to prevent wrap-around; write to output array
    out32 = (state3 + 512) >> 10;
    *out++ = WebRtcSpl_SatW32ToW16(out32);

    // upper allpass filter
    diff = in32 - state5;
    tmp1 = MUL_ACCUM_1(kResampleAllpass2[0], diff, state4);
    state4 = in32;
    diff = tmp1 - state6;
    tmp2 = MUL_ACCUM_2(kResampleAllpass2[1], diff, state5);
    state5 = tmp1;
    diff = tmp2 - state7;
    state7 = MUL_ACCUM_2(kResampleAllpass2[2], diff, state6);
    state6 = tmp2;

    // round; limit amplitude to prevent wrap-around; write to output array
    out32 = (state7 + 512) >> 10;
    *out++ = WebRtcSpl_SatW32ToW16(out32);
  }

  filtState[0] = state0;
  filtState[1] = state1;
  filtState[2] = state2;
  filtState[3] = state3;
  filtState[4] = state4;
  filtState[5] = state5;
  filtState[6] = state6;
  filtState[7] = state7;
}